

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O3

uint __thiscall
Lib::
BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>_>
::bubbleUp(BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>_>
           *this,uint index)

{
  UnresolvedSplitRecord *pUVar1;
  UnresolvedSplitRecord *pUVar2;
  UnresolvedSplitRecord *pUVar3;
  bool bVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  undefined4 uVar7;
  uint uVar8;
  undefined4 uVar9;
  Comparison CVar10;
  ulong uVar11;
  
  if (1 < index) {
    uVar11 = (ulong)index;
    do {
      uVar11 = uVar11 >> 1;
      CVar10 = Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>::compare
                         (this->_data1 + index,this->_data1 + uVar11);
      if (CVar10 != LESS) {
        return index;
      }
      pUVar3 = this->_data1;
      pUVar1 = pUVar3 + index;
      uVar8 = pUVar1->var;
      uVar9 = *(undefined4 *)&pUVar1->field_0x4;
      uVar5 = (pUVar1->original)._content;
      pUVar1 = pUVar3 + uVar11;
      uVar7 = *(undefined4 *)&pUVar1->field_0x4;
      uVar6 = (pUVar1->original)._content;
      pUVar2 = pUVar3 + index;
      pUVar2->var = pUVar1->var;
      *(undefined4 *)&pUVar2->field_0x4 = uVar7;
      (pUVar2->original)._content = uVar6;
      pUVar3 = pUVar3 + uVar11;
      pUVar3->var = uVar8;
      *(undefined4 *)&pUVar3->field_0x4 = uVar9;
      (pUVar3->original)._content = uVar5;
      bVar4 = 3 < index;
      index = (uint)uVar11;
    } while (bVar4);
  }
  return 1;
}

Assistant:

unsigned bubbleUp(unsigned index)
  {
    ASS(index>0 && index<=_size);
    unsigned nextIndex=index>>1;
    while(nextIndex) {
      if(Comparator::compare(_data1[index], _data1[nextIndex])==LESS) {
	std::swap(_data1[index], _data1[nextIndex]);
      } else {
	return index;
      }
      index=nextIndex;
      nextIndex=index>>1;
    }
    return 1;
  }